

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void OutputCompilerStatistics(CompilerStatistics *statistics,uint outerTotalMicros)

{
  uint uVar1;
  uint uVar2;
  Timer *pTVar3;
  Timer *timer;
  uint i;
  uint total;
  undefined1 local_258 [8];
  OutputContext outputCtx;
  uint outerTotalMicros_local;
  CompilerStatistics *statistics_local;
  
  outputCtx.closeStream._4_4_ = outerTotalMicros;
  OutputContext::OutputContext((OutputContext *)local_258);
  outputCtx._536_8_ = OutputContext::FileOpen("time_stats.txt");
  outputCtx.openStream = OutputContext::FileWrite;
  uVar1 = CompilerStatistics::Total(statistics);
  timer._4_4_ = 0;
  while( true ) {
    uVar2 = SmallArray<CompilerStatistics::Timer,_16U>::size(&statistics->timers);
    if (uVar2 <= timer._4_4_) break;
    pTVar3 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&statistics->timers,timer._4_4_)
    ;
    OutputContext::Printf
              ((OutputContext *)local_258,"%15s %6dms (%3d%%)\n",(pTVar3->outputName).begin,
               (ulong)pTVar3->total / 1000,
               (ulong)(uint)(int)(((double)pTVar3->total * 100.0) / (double)uVar1));
    timer._4_4_ = timer._4_4_ + 1;
  }
  OutputContext::Printf
            ((OutputContext *)local_258,"%15s %6dms (%6dms)\n","total",(ulong)(uVar1 / 1000),
             (ulong)(outputCtx.closeStream._4_4_ / 1000));
  OutputContext::Flush((OutputContext *)local_258);
  OutputContext::FileClose((void *)outputCtx._536_8_);
  outputCtx.tempBufSize = 0;
  outputCtx._540_4_ = 0;
  OutputContext::~OutputContext((OutputContext *)local_258);
  return;
}

Assistant:

void OutputCompilerStatistics(CompilerStatistics &statistics, unsigned outerTotalMicros)
{
	OutputContext outputCtx;

	outputCtx.stream = OutputContext::FileOpen("time_stats.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	unsigned total = statistics.Total();

	for(unsigned i = 0; i < statistics.timers.size(); i++)
	{
		CompilerStatistics::Timer &timer = statistics.timers[i];

		outputCtx.Printf("%15s %6dms (%3d%%)\n", timer.outputName.begin, timer.total / 1000, int(timer.total * 100.0 / total));
	}

	outputCtx.Printf("%15s %6dms (%6dms)\n", "total", total / 1000, outerTotalMicros / 1000);

	outputCtx.Flush();

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}